

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_DeprecatedFeature_Test::
FeaturesTest_DeprecatedFeature_Test(FeaturesTest_DeprecatedFeature_Test *this)

{
  FeaturesTest_DeprecatedFeature_Test *this_local;
  
  FeaturesTest::FeaturesTest(&this->super_FeaturesTest);
  (this->super_FeaturesTest).super_FeaturesBaseTest.super_Test._vptr_Test =
       (_func_int **)&PTR__FeaturesTest_DeprecatedFeature_Test_029ae408;
  return;
}

Assistant:

TEST_F(FeaturesTest, DeprecatedFeature) {
  pool_.AddDirectInputFile("foo.proto");
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  BuildFileWithWarnings(
      R"pb(
        name: "foo.proto"
        syntax: "editions"
        edition: EDITION_2023
        dependency: "google/protobuf/unittest_features.proto"
        options {
          uninterpreted_option {
            name { name_part: "features" is_extension: false }
            name { name_part: "pb.test" is_extension: true }
            name { name_part: "removed_feature" is_extension: false }
            identifier_value: "VALUE9"
          }
        }
      )pb",
      "foo.proto: foo.proto: NAME: Feature "
      "pb.TestFeatures.removed_feature has been deprecated in edition 2023: "
      "Custom feature deprecation warning\n");
  const FileDescriptor* file = pool_.FindFileByName("foo.proto");
  ASSERT_THAT(file, NotNull());

  EXPECT_EQ(GetFeatures(file).GetExtension(pb::test).removed_feature(),
            pb::VALUE9);
}